

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

void emplace_uint64(uint8_t *buffer,uint64_t d)

{
  uint64_t d_local;
  uint8_t *buffer_local;
  
  *buffer = (uint8_t)(d >> 0x38);
  buffer[1] = (uint8_t)(d >> 0x30);
  buffer[2] = (uint8_t)(d >> 0x28);
  buffer[3] = (uint8_t)(d >> 0x20);
  buffer[4] = (uint8_t)(d >> 0x18);
  buffer[5] = (uint8_t)(d >> 0x10);
  buffer[6] = (uint8_t)(d >> 8);
  buffer[7] = (uint8_t)d;
  return;
}

Assistant:

static void emplace_uint64(uint8_t *buffer, uint64_t d)
{
    buffer[0] = ((d>>56) & 0xff);
    buffer[1] = ((d>>48) & 0xff);
    buffer[2] = ((d>>40) & 0xff);
    buffer[3] = ((d>>32) & 0xff);
    buffer[4] = ((d>>24) & 0xff);
    buffer[5] = ((d>>16) & 0xff);
    buffer[6] = ((d>>8)  & 0xff);
    buffer[7] = ((d>>0)  & 0xff);
}